

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInit.c
# Opt level: O1

int cuddZddInitUniv(DdManager *zdd)

{
  int *piVar1;
  uint uVar2;
  DdNode **ppDVar3;
  DdNode *pDVar4;
  ulong uVar5;
  DdNode *T;
  
  uVar2 = zdd->sizeZ;
  ppDVar3 = (DdNode **)malloc((long)(int)uVar2 * 8);
  zdd->univ = ppDVar3;
  if (ppDVar3 == (DdNode **)0x0) {
    zdd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    uVar5 = (ulong)uVar2;
    T = zdd->one;
    piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    do {
      if ((int)uVar5 < 1) {
        return 1;
      }
      pDVar4 = cuddUniqueInterZdd(zdd,zdd->invpermZ[uVar5 - 1],T,T);
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(zdd,T);
        if (zdd->univ != (DdNode **)0x0) {
          free(zdd->univ);
          zdd->univ = (DdNode **)0x0;
        }
      }
      else {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        zdd->univ[uVar5 - 1] = pDVar4;
      }
      uVar5 = uVar5 - 1;
      T = pDVar4;
    } while (pDVar4 != (DdNode *)0x0);
  }
  return 0;
}

Assistant:

int
cuddZddInitUniv(
  DdManager * zdd)
{
    DdNode      *p, *res;
    int         i;

    zdd->univ = ABC_ALLOC(DdNodePtr, zdd->sizeZ);
    if (zdd->univ == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    res = DD_ONE(zdd);
    cuddRef(res);
    for (i = zdd->sizeZ - 1; i >= 0; i--) {
        unsigned int index = zdd->invpermZ[i];
        p = res;
        res = cuddUniqueInterZdd(zdd, index, p, p);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(zdd,p);
            ABC_FREE(zdd->univ);
            return(0);
        }
        cuddRef(res);
        cuddDeref(p);
        zdd->univ[i] = res;
    }

#ifdef DD_VERBOSE
    cuddZddP(zdd, zdd->univ[0]);
#endif

    return(1);

}